

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t PAL_towupper(char16_t c)

{
  BOOL BVar1;
  UnicodeDataRec local_14;
  UnicodeDataRec dataRec;
  char16_t c_local;
  
  dataRec.nUnicodeValue = c;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = GetUnicodeData((uint)(ushort)c,&local_14);
  if (BVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dataRec.C1_TYPE_FLAGS = dataRec.nUnicodeValue;
  }
  else if (((local_14.C1_TYPE_FLAGS & 1) == 0) && (local_14.nOpposingCase != L'\0')) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dataRec.C1_TYPE_FLAGS = local_14.nOpposingCase;
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dataRec.C1_TYPE_FLAGS = dataRec.nUnicodeValue;
  }
  return dataRec.C1_TYPE_FLAGS;
}

Assistant:

char16_t
__cdecl
PAL_towupper( char16_t c )
{
#if HAVE_COREFOUNDATION
    PERF_ENTRY(towupper);
    ENTRY("towupper (c=%d)\n", c);
    if (!PAL_iswupper(c))
    {
        CFMutableStringRef cfString = CFStringCreateMutable(
                                            kCFAllocatorDefault, 1);
        if (cfString != NULL)
        {
            CFStringAppendCharacters(cfString, (const UniChar*)&c, 1);
            CFStringUppercase(cfString, NULL);
            c = CFStringGetCharacterAtIndex(cfString, 0);
            CFRelease(cfString);
        }
    }
    LOGEXIT("towupper returns int %d\n", c );
    PERF_EXIT(towupper);
    return c;
#else   /* HAVE_COREFOUNDATION */
    UnicodeDataRec dataRec;

    PERF_ENTRY(towupper);
    ENTRY("towupper (c=%d)\n", c);

    if (!GetUnicodeData(c, &dataRec))
    {
        TRACE( "Unable to retrieve unicode data for the character %c.\n", c );
        LOGEXIT("towupper returns int %d\n", c );
        PERF_EXIT(towupper);
        return c;
    }

    if ( (dataRec.C1_TYPE_FLAGS & C1_UPPER) || (dataRec.nOpposingCase ==  0 ))
    {
        LOGEXIT("towupper returns int %d\n", c );
        PERF_EXIT(towupper);
        return c;
    }
    else
    {
        LOGEXIT("towupper returns int %d\n", dataRec.nOpposingCase );
        PERF_EXIT(towupper);
        return dataRec.nOpposingCase;
    }
#endif  /* HAVE_COREFOUNDATION */
}